

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

HighsTripletTreeSliceInOrder * __thiscall
presolve::HPresolve::getSortedRowVector
          (HighsTripletTreeSliceInOrder *__return_storage_ptr__,HPresolve *this,HighsInt row)

{
  int iVar1;
  pointer pdVar2;
  pointer piVar3;
  pointer piVar4;
  
  pdVar2 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = (this->rowroot).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[row];
  (__return_storage_ptr__->super_HighsMatrixSlice<HighsTripletTreeSliceInOrder>).nodeIndex =
       (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (__return_storage_ptr__->super_HighsMatrixSlice<HighsTripletTreeSliceInOrder>).nodeValue = pdVar2;
  (__return_storage_ptr__->super_HighsMatrixSlice<HighsTripletTreeSliceInOrder>).nodeLeft = piVar3;
  (__return_storage_ptr__->super_HighsMatrixSlice<HighsTripletTreeSliceInOrder>).nodeRight = piVar4;
  (__return_storage_ptr__->super_HighsMatrixSlice<HighsTripletTreeSliceInOrder>).root = iVar1;
  return __return_storage_ptr__;
}

Assistant:

HighsTripletTreeSliceInOrder HPresolve::getSortedRowVector(HighsInt row) const {
  return HighsTripletTreeSliceInOrder(Acol.data(), Avalue.data(), ARleft.data(),
                                      ARright.data(), rowroot[row]);
}